

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Matrix33d * gmath::createRx(Matrix33d *__return_storage_ptr__,double a)

{
  undefined1 auVar1 [16];
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar1 = _DAT_00121080;
  lVar2 = 0;
  auVar4 = _DAT_00121070;
  do {
    if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar2 + 8) = 0x3ff0000000000000;
    }
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x80);
  __return_storage_ptr__->v[0][0] = 1.0;
  *(double *)((long)(__return_storage_ptr__->v + 0) + 8) = 0.0;
  *(double *)((long)(__return_storage_ptr__->v + 0) + 0x10) = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  dVar3 = cos(a);
  __return_storage_ptr__->v[1][1] = dVar3;
  dVar3 = sin(a);
  __return_storage_ptr__->v[1][2] = -dVar3;
  __return_storage_ptr__->v[2][0] = 0.0;
  dVar3 = sin(a);
  __return_storage_ptr__->v[2][1] = dVar3;
  dVar3 = cos(a);
  __return_storage_ptr__->v[2][2] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createRx(double a)
{
  Matrix33d ret;

  ret(0, 0)=1.0;
  ret(0, 1)=0.0;
  ret(0, 2)=0.0;

  ret(1, 0)=0.0;
  ret(1, 1)=cos(a);
  ret(1, 2)=-sin(a);

  ret(2, 0)=0.0;
  ret(2, 1)=sin(a);
  ret(2, 2)=cos(a);

  return ret;
}